

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::processLinkingCommand(CommonCore *this,ActionMessage *cmd)

{
  byte *pbVar1;
  size_t sVar2;
  byte *pbVar3;
  GlobalHandle GVar4;
  InterfaceHandle IVar5;
  BasicHandleInfo *pBVar6;
  string *psVar7;
  action_t newAction;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view interfaceName;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view alias;
  
  switch(cmd->messageAction) {
  case cmd_data_link:
    name._M_str = (char *)(cmd->payload).heap;
    name._M_len = (cmd->payload).bufferSize;
    pBVar6 = HandleManager::getInterfaceHandle(&this->loopHandles,name,PUBLICATION);
    psVar7 = ActionMessage::getString_abi_cxx11_(cmd,0);
    pbVar3 = (byte *)(psVar7->_M_dataplus)._M_p;
    sVar2 = psVar7->_M_string_length;
    if (pBVar6 == (BasicHandleInfo *)0x0) {
      name_03._M_str = (char *)pbVar3;
      name_03._M_len = sVar2;
      pBVar6 = HandleManager::getInterfaceHandle(&this->loopHandles,name_03,INPUT);
      if (pBVar6 == (BasicHandleInfo *)0x0) {
LAB_00302fdf:
        routeMessage(this,cmd);
        return;
      }
      newAction = cmd_add_named_publication;
    }
    else {
      if ((cmd->payload).heap == pbVar3) {
        (cmd->payload).bufferSize = sVar2;
      }
      else {
        SmallBuffer::reserve(&cmd->payload,sVar2);
        (cmd->payload).bufferSize = sVar2;
        if (sVar2 != 0) {
          memcpy((cmd->payload).heap,pbVar3,sVar2);
        }
      }
      newAction = cmd_add_named_input;
    }
    ActionMessage::setAction(cmd,newAction);
    IVar5.hid = (pBVar6->handle).handle.hid;
    cmd->source_id = (GlobalFederateId)(pBVar6->handle).fed_id.gid;
    cmd->source_handle = (InterfaceHandle)IVar5.hid;
    break;
  default:
    return;
  case cmd_filter_link:
    name_01._M_str = (char *)(cmd->payload).heap;
    name_01._M_len = (cmd->payload).bufferSize;
    pBVar6 = HandleManager::getInterfaceHandle(&this->loopHandles,name_01,FILTER);
    psVar7 = ActionMessage::getString_abi_cxx11_(cmd,0);
    pbVar3 = (byte *)(psVar7->_M_dataplus)._M_p;
    sVar2 = psVar7->_M_string_length;
    if (pBVar6 == (BasicHandleInfo *)0x0) {
      name_04._M_str = (char *)pbVar3;
      name_04._M_len = sVar2;
      pBVar6 = HandleManager::getInterfaceHandle(&this->loopHandles,name_04,ENDPOINT);
      if (pBVar6 == (BasicHandleInfo *)0x0) goto LAB_00302fdf;
      ActionMessage::setAction(cmd,cmd_add_named_filter);
      IVar5.hid = (pBVar6->handle).handle.hid;
      cmd->source_id = (GlobalFederateId)(pBVar6->handle).fed_id.gid;
      cmd->source_handle = (InterfaceHandle)IVar5.hid;
    }
    else {
      if ((cmd->payload).heap == pbVar3) {
        (cmd->payload).bufferSize = sVar2;
      }
      else {
        SmallBuffer::reserve(&cmd->payload,sVar2);
        (cmd->payload).bufferSize = sVar2;
        if (sVar2 != 0) {
          memcpy((cmd->payload).heap,pbVar3,sVar2);
        }
      }
      ActionMessage::setAction(cmd,cmd_add_named_endpoint);
      IVar5.hid = (pBVar6->handle).handle.hid;
      cmd->source_id = (GlobalFederateId)(pBVar6->handle).fed_id.gid;
      cmd->source_handle = (InterfaceHandle)IVar5.hid;
      if ((pBVar6->flags & 0x200) != 0) {
        pbVar1 = (byte *)((long)&cmd->flags + 1);
        *pbVar1 = *pbVar1 | 2;
      }
    }
    goto LAB_0030304d;
  case cmd_endpoint_link:
    name_00._M_str = (char *)(cmd->payload).heap;
    name_00._M_len = (cmd->payload).bufferSize;
    pBVar6 = HandleManager::getInterfaceHandle(&this->loopHandles,name_00,ENDPOINT);
    psVar7 = ActionMessage::getString_abi_cxx11_(cmd,0);
    pbVar3 = (byte *)(psVar7->_M_dataplus)._M_p;
    sVar2 = psVar7->_M_string_length;
    if (pBVar6 == (BasicHandleInfo *)0x0) {
      name_02._M_str = (char *)pbVar3;
      name_02._M_len = sVar2;
      pBVar6 = HandleManager::getInterfaceHandle(&this->loopHandles,name_02,ENDPOINT);
      if (pBVar6 == (BasicHandleInfo *)0x0) goto LAB_00302fdf;
      ActionMessage::setAction(cmd,cmd_add_named_endpoint);
      GVar4 = pBVar6->handle;
      (cmd->source_id).gid = GVar4.fed_id.gid.gid;
      (cmd->source_handle).hid = GVar4.handle.hid.hid;
      cmd->counter = 0x65;
    }
    else {
      if ((cmd->payload).heap == pbVar3) {
        (cmd->payload).bufferSize = sVar2;
      }
      else {
        SmallBuffer::reserve(&cmd->payload,sVar2);
        (cmd->payload).bufferSize = sVar2;
        if (sVar2 != 0) {
          memcpy((cmd->payload).heap,pbVar3,sVar2);
        }
      }
      ActionMessage::setAction(cmd,cmd_add_named_endpoint);
      cmd->counter = 0x65;
      IVar5.hid = (pBVar6->handle).handle.hid;
      cmd->source_id = (GlobalFederateId)(pBVar6->handle).fed_id.gid;
      cmd->source_handle = (InterfaceHandle)IVar5.hid;
      *(byte *)&cmd->flags = (byte)cmd->flags | 2;
    }
    break;
  case cmd_add_alias:
    sVar2 = (cmd->payload).bufferSize;
    pbVar3 = (cmd->payload).heap;
    psVar7 = ActionMessage::getString_abi_cxx11_(cmd,0);
    interfaceName._M_str = (char *)pbVar3;
    interfaceName._M_len = sVar2;
    alias._M_str = (psVar7->_M_dataplus)._M_p;
    alias._M_len = psVar7->_M_string_length;
    HandleManager::addAlias(&this->loopHandles,interfaceName,alias);
    routeMessage(this,cmd,(GlobalFederateId)0x0);
    return;
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&cmd->stringData,
                    (cmd->stringData).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
LAB_0030304d:
  checkForNamedInterface(this,cmd);
  return;
}

Assistant:

void CommonCore::processLinkingCommand(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_DATA_LINK: {
            auto* pub = loopHandles.getInterfaceHandle(cmd.name(), InterfaceType::PUBLICATION);
            if (pub != nullptr) {
                cmd.name(cmd.getString(targetStringLoc));
                cmd.setAction(CMD_ADD_NAMED_INPUT);
                cmd.setSource(pub->handle);
                cmd.clearStringData();
                checkForNamedInterface(cmd);
            } else {
                auto* input = loopHandles.getInterfaceHandle(cmd.getString(targetStringLoc),
                                                             InterfaceType::INPUT);
                if (input == nullptr) {
                    routeMessage(cmd);
                } else {
                    cmd.setAction(CMD_ADD_NAMED_PUBLICATION);
                    cmd.setSource(input->handle);
                    cmd.clearStringData();
                    checkForNamedInterface(cmd);
                }
            }
        } break;
        case CMD_ENDPOINT_LINK: {
            auto* ept = loopHandles.getInterfaceHandle(cmd.name(), InterfaceType::ENDPOINT);
            if (ept != nullptr) {
                cmd.name(cmd.getString(targetStringLoc));
                cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                cmd.counter = static_cast<uint16_t>(InterfaceType::ENDPOINT);
                cmd.setSource(ept->handle);
                setActionFlag(cmd, destination_target);
                cmd.clearStringData();
                checkForNamedInterface(cmd);
            } else {
                auto* target = loopHandles.getInterfaceHandle(cmd.getString(targetStringLoc),
                                                              InterfaceType::ENDPOINT);
                if (target == nullptr) {
                    routeMessage(cmd);
                } else {
                    cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                    cmd.setSource(target->handle);
                    cmd.counter = static_cast<uint16_t>(InterfaceType::ENDPOINT);
                    cmd.clearStringData();
                    checkForNamedInterface(cmd);
                }
            }
        } break;
        case CMD_FILTER_LINK: {
            auto* filt = loopHandles.getInterfaceHandle(cmd.name(), InterfaceType::FILTER);
            if (filt != nullptr) {
                cmd.name(cmd.getString(targetStringLoc));
                cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                cmd.setSource(filt->handle);
                if (checkActionFlag(*filt, clone_flag)) {
                    setActionFlag(cmd, clone_flag);
                }
                checkForNamedInterface(cmd);
            } else {
                auto* ept = loopHandles.getInterfaceHandle(cmd.getString(targetStringLoc),
                                                           InterfaceType::ENDPOINT);
                if (ept == nullptr) {
                    routeMessage(cmd);
                } else {
                    cmd.setAction(CMD_ADD_NAMED_FILTER);
                    cmd.setSource(ept->handle);
                    checkForNamedInterface(cmd);
                }
            }
        } break;
        case CMD_ADD_ALIAS: {
            loopHandles.addAlias(cmd.payload.to_string(), cmd.getString(targetStringLoc));
            routeMessage(std::move(cmd), parent_broker_id);
        } break;
        default:
            break;
    }
}